

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9CompileFor(jx9_gen_state *pGen)

{
  uint uVar1;
  uint uVar2;
  SyToken *pSVar3;
  void *pvVar4;
  SySet *pSVar5;
  GenBlock *pBlock;
  SyToken *pSVar6;
  sxi32 sVar7;
  sxi32 sVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  char *zFormat;
  sxu32 nLine;
  ulong uVar12;
  SyToken *pSVar13;
  SyToken *pSVar14;
  GenBlock *pForBlock;
  sxu32 nFalseJump;
  GenBlock *local_58;
  sxu32 local_4c;
  SyToken *local_48;
  SyToken *pSStack_40;
  undefined4 local_30;
  sxu32 local_2c;
  
  local_58 = (GenBlock *)0x0;
  pSVar3 = pGen->pIn;
  pSVar14 = pGen->pEnd;
  nLine = pSVar3->nLine;
  pGen->pIn = pSVar3 + 1;
  if ((pSVar3 + 1 < pSVar14) && ((pSVar3[1].nType & 0x200) != 0)) {
    pSVar13 = pSVar3 + 2;
    pGen->pIn = pSVar13;
    if (pSVar13 < pSVar14) {
      pSVar13 = pSVar3 + 2;
      iVar11 = 1;
      lVar9 = 0;
      do {
        if ((pSVar13->nType >> 9 & 1) == 0) {
          if ((pSVar13->nType >> 10 & 1) != 0) {
            if (iVar11 < 2) {
              if (lVar9 == 0) goto LAB_001264ca;
              break;
            }
            iVar11 = iVar11 + -1;
          }
        }
        else {
          iVar11 = iVar11 + 1;
        }
        lVar9 = lVar9 + -0x20;
        pSVar13 = pSVar13 + 1;
      } while (pSVar13 < pSVar14);
      if (pSVar13 < pSVar14) {
        pGen->pEnd = pSVar13;
        sVar8 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
        if (sVar8 == -10) {
          return -10;
        }
        if (sVar8 != -3) {
          jx9VmEmitInstr(pGen->pVm,0xb,1,0,(void *)0x0,(sxu32 *)0x0);
        }
        pSVar3 = pGen->pIn;
        if ((pSVar3->nType & 0x40000) == 0) {
          nLine = pSVar3->nLine;
          zFormat = "for: Expected \';\' after initialization expressions";
        }
        else {
          pGen->pIn = pSVar3 + 1;
          sVar8 = GenStateEnterBlock(pGen,1,pGen->pVm->pByteContainer->nUsed,(void *)0x0,&local_58);
          if (sVar8 != 0) {
            return -10;
          }
          local_58->bPostContinue = '\x01';
          sVar8 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
          if (sVar8 == -10) {
            return -10;
          }
          if (sVar8 != -3) {
            jx9VmEmitInstr(pGen->pVm,9,0,0,(void *)0x0,&local_4c);
            local_30 = 9;
            local_2c = local_4c;
            SySetPut(&local_58->aJumpFix,&local_30);
          }
          pSVar3 = pGen->pIn;
          if ((pSVar3->nType & 0x40000) == 0) {
            nLine = pSVar3->nLine;
            zFormat = "for: Expected \';\' after conditionals expressions";
          }
          else {
            pGen->pIn = pSVar13 + 1;
            pGen->pEnd = pSVar14;
            sVar8 = jx9CompileBlock(pGen);
            if (sVar8 == -10) {
              return -10;
            }
            uVar10 = (ulong)(local_58->aPostContFix).nUsed;
            if (uVar10 != 0) {
              pvVar4 = (local_58->aPostContFix).pBase;
              pSVar5 = pGen->pVm->pByteContainer;
              uVar1 = pSVar5->nUsed;
              uVar12 = 0;
              do {
                uVar2 = *(uint *)((long)pvVar4 + uVar12 * 8 + 4);
                if ((uVar2 < uVar1) && (pSVar5->pBase != (void *)0x0)) {
                  *(uint *)((long)pSVar5->pBase + (ulong)(uVar2 * pSVar5->eSize) + 8) = uVar1;
                }
                uVar12 = uVar12 + 1;
              } while (uVar10 != uVar12);
            }
            do {
              pSVar14 = pSVar3 + 1;
              if (pSVar13 <= pSVar14) goto LAB_001266c3;
              pSVar6 = pSVar3 + 1;
              pSVar3 = pSVar14;
            } while ((pSVar6->nType & 0x40000) != 0);
            local_48 = pGen->pIn;
            pSStack_40 = pGen->pEnd;
            pGen->pIn = pSVar14;
            pGen->pEnd = pSVar13;
            sVar8 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
            if (pGen->pEnd <= pGen->pIn) {
              pGen->pIn = local_48;
              pGen->pEnd = pSStack_40;
              if (sVar8 == -10) {
                return -10;
              }
              if (sVar8 != -3) {
                jx9VmEmitInstr(pGen->pVm,0xb,1,0,(void *)0x0,(sxu32 *)0x0);
              }
LAB_001266c3:
              jx9VmEmitInstr(pGen->pVm,8,0,local_58->nFirstInstr,(void *)0x0,(sxu32 *)0x0);
              GenStateFixJumps(local_58,-1,pGen->pVm->pByteContainer->nUsed);
              pBlock = pGen->pCurrent;
              if (pBlock == (GenBlock *)0x0) {
                return 0;
              }
              pGen->pCurrent = pBlock->pParent;
              GenStateFreeBlock(pBlock);
              return 0;
            }
            nLine = pGen->pIn->nLine;
            zFormat = "for: Expected \')\' after post-expressions";
          }
        }
        goto LAB_001263f7;
      }
    }
LAB_001264ca:
    sVar7 = jx9GenCompileError(pGen,1,nLine,"for: Invalid expression");
    sVar8 = -10;
    if (sVar7 != -10) {
      pGen->pIn = pSVar13;
      if (pSVar13 < pGen->pEnd) {
        pGen->pIn = pSVar13 + 1;
      }
      sVar8 = 0;
    }
  }
  else {
    zFormat = "Expected \'(\' after \'for\' keyword";
LAB_001263f7:
    sVar8 = 0;
    sVar7 = jx9GenCompileError(pGen,1,nLine,zFormat);
    if (sVar7 == -10) {
      sVar8 = -10;
    }
  }
  return sVar8;
}

Assistant:

static sxi32 jx9CompileFor(jx9_gen_state *pGen)
{
	SyToken *pTmp, *pPostStart, *pEnd = 0;
	GenBlock *pForBlock = 0;
	sxu32 nFalseJump;
	sxu32 nLine;
	sxi32 rc;
	nLine = pGen->pIn->nLine;
	/* Jump the 'for' keyword */
	pGen->pIn++;    
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_LPAREN) == 0 ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Expected '(' after 'for' keyword");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		return SXRET_OK;
	}
	/* Jump the left parenthesis '(' */
	pGen->pIn++; 
	/* Delimit the init-expr;condition;post-expr */
	jx9DelimitNestedTokens(pGen->pIn, pGen->pEnd, JX9_TK_LPAREN /* '(' */, JX9_TK_RPAREN /* ')' */, &pEnd);
	if( pGen->pIn == pEnd || pEnd >= pGen->pEnd ){
		/* Empty expression */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "for: Invalid expression");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		/* Synchronize */
		pGen->pIn = pEnd;
		if( pGen->pIn < pGen->pEnd ){
			pGen->pIn++;
		}
		return SXRET_OK;
	}
	/* Swap token streams */
	pTmp = pGen->pEnd;
	pGen->pEnd = pEnd;
	/* Compile initialization expressions if available */
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	/* Pop operand lvalues */
	if( rc == SXERR_ABORT ){
		/* Expression handler request an operation abort [i.e: Out-of-memory] */
		return SXERR_ABORT;
	}else if( rc != SXERR_EMPTY ){
		jx9VmEmitInstr(pGen->pVm, JX9_OP_POP, 1, 0, 0, 0);
	}
	if( (pGen->pIn->nType & JX9_TK_SEMI) == 0 ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, pGen->pIn->nLine, 
			"for: Expected ';' after initialization expressions");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		return SXRET_OK;
	}
	/* Jump the trailing ';' */
	pGen->pIn++;
	/* Create the loop block */
	rc = GenStateEnterBlock(&(*pGen), GEN_BLOCK_LOOP, jx9VmInstrLength(pGen->pVm), 0, &pForBlock);
	if( rc != SXRET_OK ){
		return SXERR_ABORT;
	}
	/* Deffer continue jumps */
	pForBlock->bPostContinue = TRUE;
	/* Compile the condition */
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	if( rc == SXERR_ABORT ){
		/* Expression handler request an operation abort [i.e: Out-of-memory] */
		return SXERR_ABORT;
	}else if( rc != SXERR_EMPTY ){
		/* Emit the false jump */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_JZ, 0, 0, 0, &nFalseJump);
		/* Save the instruction index so we can fix it later when the jump destination is resolved */
		GenStateNewJumpFixup(pForBlock, JX9_OP_JZ, nFalseJump);
	}
	if( (pGen->pIn->nType & JX9_TK_SEMI) == 0 ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, pGen->pIn->nLine, 
			"for: Expected ';' after conditionals expressions");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		return SXRET_OK;
	}
	/* Jump the trailing ';' */
	pGen->pIn++;
	/* Save the post condition stream */
	pPostStart = pGen->pIn;
	/* Compile the loop body */
	pGen->pIn  = &pEnd[1]; /* Jump the trailing parenthesis ')' */
	pGen->pEnd = pTmp;
	rc = jx9CompileBlock(&(*pGen));
	if( rc == SXERR_ABORT ){
		return SXERR_ABORT;
	}
	/* Fix post-continue jumps */
	if( SySetUsed(&pForBlock->aPostContFix) > 0 ){
		JumpFixup *aPost;
		VmInstr *pInstr;
		sxu32 nJumpDest;
		sxu32 n;
		aPost = (JumpFixup *)SySetBasePtr(&pForBlock->aPostContFix);
		nJumpDest = jx9VmInstrLength(pGen->pVm);
		for( n = 0 ; n < SySetUsed(&pForBlock->aPostContFix) ; ++n ){
			pInstr = jx9VmGetInstr(pGen->pVm, aPost[n].nInstrIdx);
			if( pInstr ){
				/* Fix jump */
				pInstr->iP2 = nJumpDest;
			}
		}
	}
	/* compile the post-expressions if available */
	while( pPostStart < pEnd && (pPostStart->nType & JX9_TK_SEMI) ){
		pPostStart++;
	}
	if( pPostStart < pEnd ){
		SyToken *pTmpIn, *pTmpEnd;
		SWAP_DELIMITER(pGen, pPostStart, pEnd);
		rc = jx9CompileExpr(&(*pGen), 0, 0);
		if( pGen->pIn < pGen->pEnd ){
			/* Syntax error */
			rc = jx9GenCompileError(pGen, E_ERROR, pGen->pIn->nLine, "for: Expected ')' after post-expressions");
			if( rc == SXERR_ABORT ){
				/* Error count limit reached, abort immediately */
				return SXERR_ABORT;
			}
			return SXRET_OK;
		}
		RE_SWAP_DELIMITER(pGen);
		if( rc == SXERR_ABORT ){
			/* Expression handler request an operation abort [i.e: Out-of-memory] */
			return SXERR_ABORT;
		}else if( rc != SXERR_EMPTY){
			/* Pop operand lvalue */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_POP, 1, 0, 0, 0);
		}
	}
	/* Emit the unconditional jump to the start of the loop */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_JMP, 0, pForBlock->nFirstInstr, 0, 0);
	/* Fix all jumps now the destination is resolved */
	GenStateFixJumps(pForBlock, -1, jx9VmInstrLength(pGen->pVm));
	/* Release the loop block */
	GenStateLeaveBlock(pGen, 0);
	/* Statement successfully compiled */
	return SXRET_OK;
}